

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

size_t __thiscall Darts::Details::Keyset<int>::lengths(Keyset<int> *this,size_t id)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  
  if (this->lengths_ != (size_t *)0x0) {
    return this->lengths_[id];
  }
  sVar3 = 0xffffffffffffffff;
  do {
    sVar1 = sVar3 + 1;
    lVar2 = sVar3 + 1;
    sVar3 = sVar1;
  } while (this->keys_[id][lVar2] != '\0');
  return sVar1;
}

Assistant:

std::size_t lengths(std::size_t id) const {
    if (has_lengths()) {
      return lengths_[id];
    }
    std::size_t length = 0;
    while (keys_[id][length] != '\0') {
      ++length;
    }
    return length;
  }